

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-chat.cpp
# Opt level: O1

void assert_msg_equals(common_chat_msg *expected,common_chat_msg *actual)

{
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  pointer pcVar5;
  pointer pcVar6;
  string_t local_e8;
  string_t local_c8;
  common_chat_msg *local_a8;
  common_chat_msg *local_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  data local_50;
  data local_40;
  
  assert_equals<std::__cxx11::string>(&expected->role,&actual->role);
  assert_equals<std::__cxx11::string>(&expected->content,&actual->content);
  local_e8._M_dataplus._M_p =
       (pointer)((long)(expected->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(expected->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
  local_c8._M_dataplus._M_p =
       (pointer)((long)(actual->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(actual->content_parts).
                       super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
  assert_equals<unsigned_long>((unsigned_long *)&local_e8,(unsigned_long *)&local_c8);
  pcVar6 = (expected->content_parts).
           super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((expected->content_parts).
      super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
      ._M_impl.super__Vector_impl_data._M_finish != pcVar6) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      pcVar1 = (actual->content_parts).
               super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
               ._M_impl.super__Vector_impl_data._M_start;
      assert_equals<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar6->type)._M_dataplus._M_p + lVar3),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar1->type)._M_dataplus._M_p + lVar3));
      assert_equals<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar6->text)._M_dataplus._M_p + lVar3),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar1->text)._M_dataplus._M_p + lVar3));
      uVar4 = uVar4 + 1;
      pcVar6 = (expected->content_parts).
               super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < (ulong)((long)(expected->content_parts).
                                   super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar6 >> 6));
  }
  assert_equals<std::__cxx11::string>(&expected->reasoning_content,&actual->reasoning_content);
  local_e8._M_dataplus._M_p =
       (pointer)(((long)(expected->tool_calls).
                        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(expected->tool_calls).
                        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  local_c8._M_dataplus._M_p =
       (pointer)(((long)(actual->tool_calls).
                        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(actual->tool_calls).
                        super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  local_a0 = actual;
  assert_equals<unsigned_long>((unsigned_long *)&local_e8,(unsigned_long *)&local_c8);
  pcVar5 = (expected->tool_calls).
           super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((expected->tool_calls).
      super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar5) {
    lVar3 = 0;
    uVar4 = 0;
    local_a8 = expected;
    do {
      pcVar2 = (local_a0->tool_calls).
               super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>.
               _M_impl.super__Vector_impl_data._M_start;
      assert_equals<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar5->name)._M_dataplus._M_p + lVar3),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar2->name)._M_dataplus._M_p + lVar3));
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_68 = (code *)0x0;
      uStack_60 = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::parse<std::__cxx11::string_const&>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar5->arguments)._M_dataplus._M_p + lVar3),
                 (parser_callback_t *)&local_78,true,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_e8,
             (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_40,-1,' ',false,strict);
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      local_88 = (code *)0x0;
      uStack_80 = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::parse<std::__cxx11::string_const&>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar2->arguments)._M_dataplus._M_p + lVar3),
                 (parser_callback_t *)&local_98,true,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_c8,
             (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_50,-1,' ',false,strict);
      assert_equals<std::__cxx11::string>(&local_e8,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      assert_equals<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar5->id)._M_dataplus._M_p + lVar3),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pcVar2->id)._M_dataplus._M_p + lVar3));
      uVar4 = uVar4 + 1;
      pcVar5 = (local_a8->tool_calls).
               super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x60;
    } while (uVar4 < (ulong)(((long)(local_a8->tool_calls).
                                    super__Vector_base<common_chat_tool_call,_std::allocator<common_chat_tool_call>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar5 >> 5)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

static void assert_msg_equals(const common_chat_msg & expected, const common_chat_msg & actual) {
    assert_equals(expected.role, actual.role);
    assert_equals(expected.content, actual.content);
    assert_equals(expected.content_parts.size(), actual.content_parts.size());
    for (size_t i = 0; i < expected.content_parts.size(); i++) {
        const auto & expected_part = expected.content_parts[i];
        const auto & actual_part   = actual.content_parts[i];
        assert_equals(expected_part.type, actual_part.type);
        assert_equals(expected_part.text, actual_part.text);
    }
    assert_equals(expected.reasoning_content, actual.reasoning_content);
    assert_equals(expected.tool_calls.size(), actual.tool_calls.size());
    for (size_t i = 0; i < expected.tool_calls.size(); i++) {
        const auto & expected_tool_call = expected.tool_calls[i];
        const auto & actual_tool_call   = actual.tool_calls[i];
        assert_equals(expected_tool_call.name, actual_tool_call.name);
        assert_equals(json::parse(expected_tool_call.arguments).dump(), json::parse(actual_tool_call.arguments).dump());
        assert_equals(expected_tool_call.id, actual_tool_call.id);
    }
}